

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::IsSubSymbolOfBuiltType(DescriptorPool *this,string *name)

{
  bool bVar1;
  DescriptorPool *in_RSI;
  long in_RDI;
  Symbol SVar2;
  Symbol symbol;
  size_type dot_pos;
  string prefix;
  string *key;
  anon_union_8_8_13f84498_for_Symbol_2 in_stack_ffffffffffffff60;
  Symbol local_80 [2];
  string local_60 [32];
  long local_40;
  string local_38 [24];
  undefined8 in_stack_ffffffffffffffe0;
  bool local_1;
  
  std::__cxx11::string::string(local_38,(string *)in_RSI);
  do {
    local_40 = std::__cxx11::string::find_last_of((char)local_38,0x2e);
    if (local_40 == -1) {
      if (*(long *)(in_RDI + 0x18) == 0) {
        local_1 = false;
      }
      else {
        local_1 = IsSubSymbolOfBuiltType(in_RSI,(string *)in_stack_ffffffffffffffe0);
      }
      goto LAB_004a4ab3;
    }
    std::__cxx11::string::substr((ulong)local_60,(ulong)local_38);
    key = (string *)local_38;
    std::__cxx11::string::operator=((string *)key,local_60);
    std::__cxx11::string::~string(local_60);
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4a49e5);
    SVar2 = Tables::FindSymbol((Tables *)in_stack_ffffffffffffff60.descriptor,key);
    in_stack_ffffffffffffff60 = SVar2.field_1;
    local_80[0].type = SVar2.type;
    local_80[0].field_1 = in_stack_ffffffffffffff60;
    bVar1 = Symbol::IsNull(local_80);
  } while ((bVar1) || (local_80[0].type == PACKAGE));
  local_1 = true;
LAB_004a4ab3:
  std::__cxx11::string::~string(local_38);
  return local_1;
}

Assistant:

bool DescriptorPool::IsSubSymbolOfBuiltType(const std::string& name) const {
  std::string prefix = name;
  for (;;) {
    std::string::size_type dot_pos = prefix.find_last_of('.');
    if (dot_pos == std::string::npos) {
      break;
    }
    prefix = prefix.substr(0, dot_pos);
    Symbol symbol = tables_->FindSymbol(prefix);
    // If the symbol type is anything other than PACKAGE, then its complete
    // definition is already known.
    if (!symbol.IsNull() && symbol.type != Symbol::PACKAGE) {
      return true;
    }
  }
  if (underlay_ != nullptr) {
    // Check to see if any prefix of this symbol exists in the underlay.
    return underlay_->IsSubSymbolOfBuiltType(name);
  }
  return false;
}